

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

void bench_ecmult_multi(void *arg,int iters)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  int in_ESI;
  long *in_RDI;
  int count;
  int iter;
  int includes_g;
  bench_data *data;
  long local_50;
  int local_20;
  
  lVar2 = in_RDI[9];
  iVar3 = (int)in_RDI[8];
  uVar1 = in_RDI[8];
  for (local_20 = 0; local_20 < (int)((ulong)(long)in_ESI / uVar1); local_20 = local_20 + 1) {
    if ((int)in_RDI[9] == 0) {
      local_50 = 0;
    }
    else {
      local_50 = in_RDI[2] + in_RDI[10] * 0x20;
    }
    (*(code *)in_RDI[7])
              (*in_RDI + 0xb8,in_RDI[1],in_RDI[0xc] + (long)local_20 * 0x80,local_50,
               bench_ecmult_multi_callback,in_RDI,(long)(iVar3 - (int)lVar2));
    in_RDI[10] = in_RDI[10] + (long)iVar3 & 0x7fff;
    in_RDI[0xb] = (in_RDI[0xb] + (long)iVar3) - 1U & 0x7fff;
  }
  return;
}

Assistant:

static void bench_ecmult_multi(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;

    int includes_g = data->includes_g;
    int iter;
    int count = data->count;
    iters = iters / data->count;

    for (iter = 0; iter < iters; ++iter) {
        data->ecmult_multi(&data->ctx->error_callback, data->scratch, &data->output[iter], data->includes_g ? &data->scalars[data->offset1] : NULL, bench_ecmult_multi_callback, arg, count - includes_g);
        data->offset1 = (data->offset1 + count) % POINTS;
        data->offset2 = (data->offset2 + count - 1) % POINTS;
    }
}